

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false>::~ConcreteMachine
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_false> *this)

{
  ~ConcreteMachine(this);
  operator_delete(this,0x245e8);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}